

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QModelIndex,int>>::emplace<std::pair<QModelIndex,int>const&>
          (QMovableArrayOps<std::pair<QModelIndex,int>> *this,qsizetype i,
          pair<QModelIndex,_int> *args)

{
  undefined8 *puVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  long lVar10;
  quintptr qVar11;
  QAbstractItemModel *pQVar12;
  long lVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  
  piVar9 = *(int **)this;
  if ((piVar9 == (int *)0x0) || (1 < *piVar9)) {
LAB_005b7a11:
    iVar6 = (args->first).r;
    iVar7 = (args->first).c;
    qVar11 = (args->first).i;
    pQVar12 = (args->first).m.ptr;
    iVar8 = args->second;
    uVar2 = args->field_0x1c;
    uVar3 = args->field_0x1d;
    uVar4 = args->field_0x1e;
    uVar5 = args->field_0x1f;
    lVar10 = *(long *)(this + 0x10);
    QArrayDataPointer<std::pair<QModelIndex,_int>_>::detachAndGrow
              ((QArrayDataPointer<std::pair<QModelIndex,_int>_> *)this,(uint)(i == 0 && lVar10 != 0)
               ,1,(pair<QModelIndex,_int> **)0x0,
               (QArrayDataPointer<std::pair<QModelIndex,_int>_> *)0x0);
    lVar13 = *(long *)(this + 8);
    if (i != 0 || lVar10 == 0) {
      piVar9 = (int *)(lVar13 + i * 0x20);
      memmove(piVar9 + 8,(void *)(lVar13 + i * 0x20),(*(long *)(this + 0x10) - i) * 0x20);
      *piVar9 = iVar6;
      piVar9[1] = iVar7;
      *(quintptr *)(piVar9 + 2) = qVar11;
      *(QAbstractItemModel **)(piVar9 + 4) = pQVar12;
      piVar9[6] = iVar8;
      *(undefined1 *)(piVar9 + 7) = uVar2;
      *(undefined1 *)((long)piVar9 + 0x1d) = uVar3;
      *(undefined1 *)((long)piVar9 + 0x1e) = uVar4;
      *(undefined1 *)((long)piVar9 + 0x1f) = uVar5;
      goto LAB_005b7b26;
    }
    *(int *)(lVar13 + -0x20) = iVar6;
    *(int *)(lVar13 + -0x1c) = iVar7;
    *(quintptr *)(lVar13 + -0x18) = qVar11;
    *(QAbstractItemModel **)(lVar13 + -0x10) = pQVar12;
    *(int *)(lVar13 + -8) = iVar8;
    *(undefined1 *)(lVar13 + -4) = uVar2;
    *(undefined1 *)(lVar13 + -3) = uVar3;
    *(undefined1 *)(lVar13 + -2) = uVar4;
    *(undefined1 *)(lVar13 + -1) = uVar5;
  }
  else {
    lVar10 = *(long *)(this + 0x10);
    if ((lVar10 == i && piVar9 != (int *)0x0) &&
       (*(long *)(piVar9 + 2) !=
        ((long)(*(long *)(this + 8) - ((long)piVar9 + 0x1fU & 0xfffffffffffffff0)) >> 5) + lVar10))
    {
      lVar13 = *(long *)(this + 8);
      uVar14 = *(undefined8 *)&args->first;
      qVar11 = (args->first).i;
      uVar15 = *(undefined8 *)&args->second;
      puVar1 = (undefined8 *)(lVar13 + 0x10 + lVar10 * 0x20);
      *puVar1 = (args->first).m.ptr;
      puVar1[1] = uVar15;
      puVar1 = (undefined8 *)(lVar13 + lVar10 * 0x20);
      *puVar1 = uVar14;
      puVar1[1] = qVar11;
      goto LAB_005b7b26;
    }
    if (((i != 0) || (piVar9 == (int *)0x0)) ||
       (((long)piVar9 + 0x1fU & 0xfffffffffffffff0) == *(ulong *)(this + 8))) goto LAB_005b7a11;
    lVar10 = *(long *)(this + 8);
    uVar14 = *(undefined8 *)&args->first;
    qVar11 = (args->first).i;
    uVar15 = *(undefined8 *)&args->second;
    *(QAbstractItemModel **)(lVar10 + -0x10) = (args->first).m.ptr;
    *(undefined8 *)(lVar10 + -8) = uVar15;
    *(undefined8 *)(lVar10 + -0x20) = uVar14;
    *(quintptr *)(lVar10 + -0x18) = qVar11;
  }
  *(long *)(this + 8) = *(long *)(this + 8) + -0x20;
LAB_005b7b26:
  *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }